

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

InterfaceHandle __thiscall
helics::CommonCore::registerPublication
          (CommonCore *this,LocalFederateId federateID,string_view key,string_view type,
          string_view units)

{
  InterfaceHandle handle;
  FederateState *this_00;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
  *p_Var1;
  ActionMessage reg;
  
  this_00 = checkNewInterface(this,federateID,key,PUBLICATION);
  p_Var1 = createBasicHandle(this,(GlobalFederateId)(this_00->global_id)._M_i.gid,
                             (LocalFederateId)(this_00->local_id).fid,PUBLICATION,key,type,units,
                             (this_00->interfaceFlags).super___atomic_base<unsigned_short>._M_i);
  handle.hid = *(BaseType *)((long)&(p_Var1->super__Hash_node_base)._M_nxt + 4);
  FederateState::createInterface
            (this_00,PUBLICATION,handle,key,type,units,
             (this_00->interfaceFlags).super___atomic_base<unsigned_short>._M_i);
  ActionMessage::ActionMessage(&reg,cmd_reg_pub);
  reg.source_id.gid = (this_00->global_id)._M_i.gid;
  reg.source_handle.hid = handle.hid;
  ActionMessage::name(&reg,key);
  reg.flags = *(uint16_t *)
               ((long)&(p_Var1->
                       super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>
                       ._M_storage._M_storage + 6);
  ActionMessage::setStringData(&reg,type,units);
  gmlc::containers::
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
  push<helics::ActionMessage>(&(this->super_BrokerBase).actionQueue,&reg);
  ActionMessage::~ActionMessage(&reg);
  return (InterfaceHandle)handle.hid;
}

Assistant:

InterfaceHandle CommonCore::registerPublication(LocalFederateId federateID,
                                                std::string_view key,
                                                std::string_view type,
                                                std::string_view units)
{
    auto* fed = checkNewInterface(federateID, key, InterfaceType::PUBLICATION);
    const auto& handle = createBasicHandle(fed->global_id,
                                           fed->local_id,
                                           InterfaceType::PUBLICATION,
                                           key,
                                           type,
                                           units,
                                           fed->getInterfaceFlags());

    auto hid = handle.handle.handle;
    fed->createInterface(
        InterfaceType::PUBLICATION, hid, key, type, units, fed->getInterfaceFlags());

    ActionMessage reg(CMD_REG_PUB);
    reg.source_id = fed->global_id.load();
    reg.source_handle = hid;
    reg.name(key);
    reg.flags = handle.flags;
    reg.setStringData(type, units);

    actionQueue.push(std::move(reg));
    return hid;
}